

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  char *pcVar1;
  ssize_t sVar2;
  int *piVar3;
  Status SVar4;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  pcVar1 = *(char **)(in_FS_OFFSET + 0x28);
  if (in_RCX != 0) {
    do {
      sVar2 = write(*(int *)(data + 0x10010),(void *)size,in_RCX);
      if (sVar2 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          if (*(char **)(in_FS_OFFSET + 0x28) == pcVar1) {
            SVar4 = PosixError((string *)this,(int)*(undefined8 *)(data + 0x10018));
            return (Status)SVar4.state_;
          }
          goto LAB_00d0ad88;
        }
      }
      else {
        size = size + sVar2;
        in_RCX = in_RCX - sVar2;
      }
    } while (in_RCX != 0);
  }
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar1) {
    return (Status)*(char **)(in_FS_OFFSET + 0x28);
  }
LAB_00d0ad88:
  __stack_chk_fail();
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }